

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O2

void __thiscall irr::CIrrDeviceSDL::logAttributes(CIrrDeviceSDL *this)

{
  int iVar1;
  double extraout_XMM0_Qa;
  double __x;
  int value;
  stringc sdl_attr;
  string<char> local_78;
  string<char> local_58;
  string<char> local_38;
  
  core::string<char>::string<char>(&sdl_attr,"SDL attribs:");
  value = 0;
  iVar1 = SDL_GL_GetAttribute(0);
  if (iVar1 == 0) {
    core::string<char>::string<char>(&local_58," r:");
    core::string<char>::string(&local_78,value);
    core::string<char>::operator+(&local_38,&local_58,&local_78);
    ::std::__cxx11::string::append((string *)&sdl_attr);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  iVar1 = SDL_GL_GetAttribute(1,&value);
  if (iVar1 == 0) {
    core::string<char>::string<char>(&local_58," g:");
    core::string<char>::string(&local_78,value);
    core::string<char>::operator+(&local_38,&local_58,&local_78);
    ::std::__cxx11::string::append((string *)&sdl_attr);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  iVar1 = SDL_GL_GetAttribute(2,&value);
  if (iVar1 == 0) {
    core::string<char>::string<char>(&local_58," b:");
    core::string<char>::string(&local_78,value);
    core::string<char>::operator+(&local_38,&local_58,&local_78);
    ::std::__cxx11::string::append((string *)&sdl_attr);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  iVar1 = SDL_GL_GetAttribute(3,&value);
  if (iVar1 == 0) {
    core::string<char>::string<char>(&local_58," a:");
    core::string<char>::string(&local_78,value);
    core::string<char>::operator+(&local_38,&local_58,&local_78);
    ::std::__cxx11::string::append((string *)&sdl_attr);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  iVar1 = SDL_GL_GetAttribute(6,&value);
  if (iVar1 == 0) {
    core::string<char>::string<char>(&local_58," depth:");
    core::string<char>::string(&local_78,value);
    core::string<char>::operator+(&local_38,&local_58,&local_78);
    ::std::__cxx11::string::append((string *)&sdl_attr);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  iVar1 = SDL_GL_GetAttribute(7,&value);
  if (iVar1 == 0) {
    core::string<char>::string<char>(&local_58," stencil:");
    core::string<char>::string(&local_78,value);
    core::string<char>::operator+(&local_38,&local_58,&local_78);
    ::std::__cxx11::string::append((string *)&sdl_attr);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  iVar1 = SDL_GL_GetAttribute(5,&value);
  if (iVar1 == 0) {
    core::string<char>::string<char>(&local_58," doublebuf:");
    core::string<char>::string(&local_78,value);
    core::string<char>::operator+(&local_38,&local_58,&local_78);
    ::std::__cxx11::string::append((string *)&sdl_attr);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  iVar1 = SDL_GL_GetAttribute(0xd,&value);
  if (iVar1 == 0) {
    core::string<char>::string<char>(&local_58," aa:");
    core::string<char>::string(&local_78,value);
    core::string<char>::operator+(&local_38,&local_58,&local_78);
    ::std::__cxx11::string::append((string *)&sdl_attr);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  iVar1 = SDL_GL_GetAttribute(0xe,&value);
  __x = extraout_XMM0_Qa;
  if (iVar1 == 0) {
    core::string<char>::string<char>(&local_58," aa-samples:");
    core::string<char>::string(&local_78,value);
    core::string<char>::operator+(&local_38,&local_58,&local_78);
    ::std::__cxx11::string::append((string *)&sdl_attr);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    __x = (double)::std::__cxx11::string::_M_dispose();
  }
  os::Printer::log((Printer *)sdl_attr.str._M_dataplus._M_p,__x);
  ::std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void CIrrDeviceSDL::logAttributes()
{
	core::stringc sdl_attr("SDL attribs:");
	int value = 0;
	if (SDL_GL_GetAttribute(SDL_GL_RED_SIZE, &value) == 0)
		sdl_attr += core::stringc(" r:") + core::stringc(value);
	if (SDL_GL_GetAttribute(SDL_GL_GREEN_SIZE, &value) == 0)
		sdl_attr += core::stringc(" g:") + core::stringc(value);
	if (SDL_GL_GetAttribute(SDL_GL_BLUE_SIZE, &value) == 0)
		sdl_attr += core::stringc(" b:") + core::stringc(value);
	if (SDL_GL_GetAttribute(SDL_GL_ALPHA_SIZE, &value) == 0)
		sdl_attr += core::stringc(" a:") + core::stringc(value);

	if (SDL_GL_GetAttribute(SDL_GL_DEPTH_SIZE, &value) == 0)
		sdl_attr += core::stringc(" depth:") + core::stringc(value);
	if (SDL_GL_GetAttribute(SDL_GL_STENCIL_SIZE, &value) == 0)
		sdl_attr += core::stringc(" stencil:") + core::stringc(value);
	if (SDL_GL_GetAttribute(SDL_GL_DOUBLEBUFFER, &value) == 0)
		sdl_attr += core::stringc(" doublebuf:") + core::stringc(value);
	if (SDL_GL_GetAttribute(SDL_GL_MULTISAMPLEBUFFERS, &value) == 0)
		sdl_attr += core::stringc(" aa:") + core::stringc(value);
	if (SDL_GL_GetAttribute(SDL_GL_MULTISAMPLESAMPLES, &value) == 0)
		sdl_attr += core::stringc(" aa-samples:") + core::stringc(value);

	os::Printer::log(sdl_attr.c_str());
}